

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

void Saig_BmcLoadCnf(Saig_Bmc_t *p,Cnf_Dat_t *pCnf)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar6;
  long lVar7;
  void *pvVar8;
  int Lits [2];
  uint local_40;
  int local_3c;
  Cnf_Dat_t *local_38;
  
  pVVar5 = p->vVisited;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    local_38 = pCnf;
    do {
      pVVar2 = p->pFrm->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        uVar1 = pVVar5->pArray[lVar7];
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar8 = pVVar2->pArray[uVar1];
      }
      lVar6 = *(long *)((long)pvVar8 + 0x28);
      *(undefined8 *)((long)pvVar8 + 0x28) = 0;
      iVar4 = pCnf->pVarNums[*(int *)(lVar6 + 0x24)];
      if (iVar4 != -1) {
        pVVar5 = p->vObj2Var;
        iVar3 = *(int *)((long)pvVar8 + 0x24);
        Vec_IntFillExtra(pVVar5,iVar3 + 1,(int)in_RDX);
        if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar5->pArray[iVar3] == 0) {
          pVVar5 = p->vObj2Var;
          iVar3 = *(int *)((long)pvVar8 + 0x24);
          Vec_IntFillExtra(pVVar5,iVar3 + 1,Fill);
          if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar5->pArray[iVar3] = iVar4;
          in_RDX = extraout_RDX_00;
          pCnf = local_38;
        }
        else {
          uVar1 = pVVar5->pArray[iVar3] * 2;
          local_3c = iVar4 * 2 + 1;
          local_40 = uVar1;
          iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                          ,0x243,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
          }
          local_3c = iVar4 * 2;
          local_40 = uVar1 | 1;
          iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
          in_RDX = extraout_RDX;
          pCnf = local_38;
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                          ,0x247,"void Saig_BmcLoadCnf(Saig_Bmc_t *, Cnf_Dat_t *)");
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vVisited;
    } while (lVar7 < pVVar5->nSize);
  }
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    if (pCnf->nClauses <= lVar6) break;
    iVar4 = sat_solver_addclause(p->pSat,pCnf->pClauses[lVar6],pCnf->pClauses[lVar6 + 1]);
    lVar7 = lVar6 + 1;
  } while (iVar4 != 0);
  if ((int)lVar6 < pCnf->nClauses) {
    puts("SAT solver became UNSAT after adding clauses.");
  }
  return;
}

Assistant:

void Saig_BmcLoadCnf( Saig_Bmc_t * p, Cnf_Dat_t * pCnf )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i, Lits[2], VarNumOld, VarNumNew;
    Aig_ManForEachObjVec( p->vVisited, p->pFrm, pObj, i )
    {
        // get the new variable of this node
        pObjNew     = (Aig_Obj_t *)pObj->pData;
        pObj->pData = NULL;
        VarNumNew   = pCnf->pVarNums[ pObjNew->Id ];
        if ( VarNumNew == -1 )
            continue;
        // get the old variable of this node
        VarNumOld   = Saig_BmcSatNum( p, pObj );
        if ( VarNumOld == 0 )
        {
            Saig_BmcSetSatNum( p, pObj, VarNumNew );
            continue;
        }
        // add clauses connecting existing variables
        Lits[0] = toLitCond( VarNumOld, 0 );
        Lits[1] = toLitCond( VarNumNew, 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( VarNumOld, 1 );
        Lits[1] = toLitCond( VarNumNew, 0 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // add CNF to the SAT solver
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            break;
    if ( i < pCnf->nClauses )
        printf( "SAT solver became UNSAT after adding clauses.\n" );
}